

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::makeDirect(QPDFObjectHandle *this,set *visited,bool stop_at_streams)

{
  pointer *ppQVar1;
  bool bVar2;
  QPDFObjGen og;
  runtime_error *prVar3;
  reference __args;
  reference this_00;
  mapped_type *this_01;
  logic_error *plVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_bool>
  pVar5;
  undefined8 local_160;
  undefined1 local_158;
  QPDFObjGen local_120;
  type *value;
  type *key;
  _Self local_108;
  iterator __end4;
  iterator __begin4;
  Dictionary *__range4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  items_1;
  QPDFObjectHandle *item;
  iterator __end3;
  iterator __begin3;
  Array *__range3;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> items;
  Array a;
  QPDFObjGen cur_og;
  bool stop_at_streams_local;
  set *visited_local;
  QPDFObjectHandle *this_local;
  
  assertInitialized(this);
  og = getObjGen(this);
  bVar2 = QPDFObjGen::set::add(visited,og);
  if (!bVar2) {
    QTC::TC("qpdf","QPDFObjectHandle makeDirect loop",0);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,"loop detected while converting object from indirect to direct");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = isBool(this);
  if ((((bVar2) || (bVar2 = isInteger(this), bVar2)) || (bVar2 = isName(this), bVar2)) ||
     (((bVar2 = isNull(this), bVar2 || (bVar2 = isReal(this), bVar2)) ||
      (bVar2 = isString(this), bVar2)))) {
    ::qpdf::BaseHandle::copy((BaseHandle *)&a.sp_elements,(EVP_PKEY_CTX *)this,(EVP_PKEY_CTX *)0x1);
    std::shared_ptr<QPDFObject>::operator=
              ((shared_ptr<QPDFObject> *)this,(shared_ptr<QPDFObject> *)&a.sp_elements);
    std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&a.sp_elements);
  }
  else {
    ppQVar1 = &items.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    as_array((Array *)ppQVar1,this,strict);
    bVar2 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)ppQVar1);
    if (bVar2) {
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range3);
      ppQVar1 = &items.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      __end3 = ::qpdf::Array::begin((Array *)ppQVar1);
      item = (QPDFObjectHandle *)::qpdf::Array::end((Array *)ppQVar1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                         *)&item), bVar2) {
        __args = __gnu_cxx::
                 __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                 ::operator*(&__end3);
        std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
        emplace_back<QPDFObjectHandle_const&>
                  ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&__range3,__args);
        this_00 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::back
                            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                             &__range3);
        makeDirect(this_00,visited,stop_at_streams);
        __gnu_cxx::
        __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
        ::operator++(&__end3);
      }
      QPDFObject::create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>&>
                ((QPDFObject *)&items_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range3);
      std::shared_ptr<QPDFObject>::operator=
                ((shared_ptr<QPDFObject> *)this,
                 (shared_ptr<QPDFObject> *)&items_1._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      std::shared_ptr<QPDFObject>::~shared_ptr
                ((shared_ptr<QPDFObject> *)&items_1._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range3);
    }
    else {
      bVar2 = isDictionary(this);
      if (bVar2) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               *)&__range4);
        as_dictionary((QPDFObjectHandle *)&__begin4,(typed)this);
        __end4 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin4);
        local_108._M_node =
             (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin4);
        while (bVar2 = std::operator!=(&__end4,&local_108), bVar2) {
          key = &std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                 ::operator*(&__end4)->first;
          value = (type *)std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>
                                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                      *)key);
          local_120 = (QPDFObjGen)
                      std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                  *)key);
          bVar2 = ::qpdf::BaseHandle::null((BaseHandle *)local_120);
          if (!bVar2) {
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
            ::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_true>
                      ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                        *)&stack0xfffffffffffffeb0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value,
                       (QPDFObjectHandle *)local_120);
            pVar5 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                    ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                              *)&__range4,(value_type *)&stack0xfffffffffffffeb0);
            local_160 = pVar5.first._M_node;
            local_158 = pVar5.second;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
            ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                     *)&stack0xfffffffffffffeb0);
            this_01 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                                    *)&__range4,(key_type *)value);
            makeDirect(this_01,visited,stop_at_streams);
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
          ::operator++(&__end4);
        }
        ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin4);
        QPDFObject::
        create<QPDF_Dictionary,std::map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>&>
                  ((QPDFObject *)&stack0xfffffffffffffe90,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                    *)&__range4);
        std::shared_ptr<QPDFObject>::operator=
                  ((shared_ptr<QPDFObject> *)this,(shared_ptr<QPDFObject> *)&stack0xfffffffffffffe90
                  );
        std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&stack0xfffffffffffffe90)
        ;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                *)&__range4);
      }
      else {
        bVar2 = isStream(this);
        if (!bVar2) {
          bVar2 = isReserved(this);
          if (bVar2) {
            plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error
                      (plVar4,"QPDFObjectHandle: attempting to make a reserved object handle direct"
                      );
            __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    (plVar4,"QPDFObjectHandle::makeDirectInternal: unknown object type");
          __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        QTC::TC("qpdf","QPDFObjectHandle copy stream",(byte)~stop_at_streams & 1);
        if (!stop_at_streams) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"attempt to make a stream into a direct object");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    ::qpdf::Array::~Array
              ((Array *)&items.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  QPDFObjGen::set::erase(visited,og);
  return;
}

Assistant:

void
QPDFObjectHandle::makeDirect(QPDFObjGen::set& visited, bool stop_at_streams)
{
    assertInitialized();

    auto cur_og = getObjGen();
    if (!visited.add(cur_og)) {
        QTC::TC("qpdf", "QPDFObjectHandle makeDirect loop");
        throw std::runtime_error("loop detected while converting object from indirect to direct");
    }

    if (isBool() || isInteger() || isName() || isNull() || isReal() || isString()) {
        this->obj = copy(true);
    } else if (auto a = as_array(strict)) {
        std::vector<QPDFObjectHandle> items;
        for (auto const& item: a) {
            items.emplace_back(item);
            items.back().makeDirect(visited, stop_at_streams);
        }
        this->obj = QPDFObject::create<QPDF_Array>(items);
    } else if (isDictionary()) {
        std::map<std::string, QPDFObjectHandle> items;
        for (auto const& [key, value]: as_dictionary(strict)) {
            if (!value.null()) {
                items.insert({key, value});
                items[key].makeDirect(visited, stop_at_streams);
            }
        }
        this->obj = QPDFObject::create<QPDF_Dictionary>(items);
    } else if (isStream()) {
        QTC::TC("qpdf", "QPDFObjectHandle copy stream", stop_at_streams ? 0 : 1);
        if (!stop_at_streams) {
            throw std::runtime_error("attempt to make a stream into a direct object");
        }
    } else if (isReserved()) {
        throw std::logic_error(
            "QPDFObjectHandle: attempting to make a reserved object handle direct");
    } else {
        throw std::logic_error("QPDFObjectHandle::makeDirectInternal: unknown object type");
    }

    visited.erase(cur_og);
}